

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

void __thiscall HTTPRequestTracker::WaitUntilEmpty(HTTPRequestTracker *this)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_owns = false;
  local_30._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_30);
  if ((this->m_tracker)._M_h._M_element_count != 0) {
    do {
      std::condition_variable::wait((unique_lock *)&this->m_cv);
    } while ((this->m_tracker)._M_h._M_element_count != 0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        WAIT_LOCK(m_mutex, lock);
        m_cv.wait(lock, [this]() EXCLUSIVE_LOCKS_REQUIRED(m_mutex) { return m_tracker.empty(); });
    }